

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.cpp
# Opt level: O0

void adios2::core::engine::ssc::DeserializeVariable
               (Buffer *input,ShapeID shapeId,uint64_t *pos,BlockInfo *b,IO *io,bool regIO,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
               *StructDefs)

{
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<unsigned_long> __l_13;
  size_t sVar1;
  bool bVar2;
  DataType DVar3;
  byte *pbVar4;
  char *pcVar5;
  uint8_t *puVar6;
  pointer pSVar7;
  unsigned_long *puVar8;
  unsigned_long uVar9;
  pointer ppVar10;
  StructDefinition *in_RCX;
  size_t *in_RDX;
  undefined4 in_ESI;
  Buffer *in_RDI;
  string *in_R8;
  byte in_R9B;
  Dims vShape_15;
  Dims vStart_15;
  Variable<std::complex<double>_> *v_15;
  Dims vShape_14;
  Dims vStart_14;
  Variable<std::complex<float>_> *v_14;
  Dims vShape_13;
  Dims vStart_13;
  Variable<long_double> *v_13;
  Dims vShape_12;
  Dims vStart_12;
  Variable<double> *v_12;
  Dims vShape_11;
  Dims vStart_11;
  Variable<float> *v_11;
  Dims vShape_10;
  Dims vStart_10;
  Variable<unsigned_long> *v_10;
  Dims vShape_9;
  Dims vStart_9;
  Variable<unsigned_int> *v_9;
  Dims vShape_8;
  Dims vStart_8;
  Variable<unsigned_short> *v_8;
  Dims vShape_7;
  Dims vStart_7;
  Variable<unsigned_char> *v_7;
  Dims vShape_6;
  Dims vStart_6;
  Variable<long> *v_6;
  Dims vShape_5;
  Dims vStart_5;
  Variable<int> *v_5;
  Dims vShape_4;
  Dims vStart_4;
  Variable<short> *v_4;
  Dims vShape_3;
  Dims vStart_3;
  Variable<signed_char> *v_3;
  Dims vShape_2;
  Dims vStart_2;
  Variable<char> *v_2;
  Dims vShape_1;
  Dims vStart_1;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *v_1;
  iterator it;
  StructDefinition *def;
  Dims vShape;
  Dims vStart;
  VariableStruct *v;
  uint8_t valueSize;
  uint8_t shapeSize;
  vector<char,_std::allocator<char>_> structDefChar;
  uint8_t structDefSize;
  vector<char,_std::allocator<char>_> name;
  uint8_t nameSize;
  undefined4 in_stack_ffffffffffffdc28;
  undefined4 in_stack_ffffffffffffdc2c;
  char *in_stack_ffffffffffffdc30;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffdc38;
  allocator *paVar11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffdc40;
  allocator<char> *in_stack_ffffffffffffdc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdc50;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffdc58;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffdc60;
  undefined8 in_stack_ffffffffffffdc68;
  undefined4 in_stack_ffffffffffffdc70;
  undefined4 uVar12;
  int in_stack_ffffffffffffdc74;
  undefined4 uVar13;
  string *in_stack_ffffffffffffdc78;
  vector *pvVar14;
  string *in_stack_ffffffffffffdc80;
  vector *pvVar15;
  string *in_stack_ffffffffffffdc88;
  undefined8 uVar16;
  string *in_stack_ffffffffffffdc90;
  undefined8 uVar17;
  allocator local_1751;
  string local_1750 [39];
  allocator local_1729;
  string local_1728 [39];
  allocator local_1701;
  string local_1700 [39];
  allocator local_16d9;
  string local_16d8 [32];
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 local_1638;
  undefined8 *local_1630;
  undefined8 local_1628;
  vector local_1620 [24];
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  unsigned_long *local_15b0;
  unsigned_long *local_15a8;
  unsigned_long *local_15a0;
  unsigned_long *local_1598;
  vector local_1590 [24];
  vector local_1578 [24];
  Variable *local_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 local_14d8;
  undefined8 *local_14d0;
  undefined8 local_14c8;
  vector local_14c0 [24];
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  unsigned_long *local_1450;
  unsigned_long *local_1448;
  unsigned_long *local_1440;
  unsigned_long *local_1438;
  vector local_1430 [24];
  vector local_1418 [24];
  Variable *local_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 local_1378;
  undefined8 *local_1370;
  undefined8 local_1368;
  vector local_1360 [24];
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  unsigned_long *local_12f0;
  unsigned_long *local_12e8;
  unsigned_long *local_12e0;
  unsigned_long *local_12d8;
  vector local_12d0 [24];
  vector local_12b8 [24];
  Variable *local_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 local_1218;
  undefined8 *local_1210;
  undefined8 local_1208;
  vector local_1200 [24];
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  unsigned_long *local_1190;
  unsigned_long *local_1188;
  unsigned_long *local_1180;
  unsigned_long *local_1178;
  vector local_1170 [24];
  vector local_1158 [24];
  Variable *local_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 local_10b8;
  undefined8 *local_10b0;
  undefined8 local_10a8;
  vector local_10a0 [24];
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  unsigned_long *local_1030;
  unsigned_long *local_1028;
  unsigned_long *local_1020;
  unsigned_long *local_1018;
  vector local_1010 [24];
  vector local_ff8 [24];
  Variable *local_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 local_f58;
  undefined8 *local_f50;
  undefined8 local_f48;
  vector local_f40 [24];
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  unsigned_long *local_ed0;
  unsigned_long *local_ec8;
  unsigned_long *local_ec0;
  unsigned_long *local_eb8;
  vector local_eb0 [24];
  vector local_e98 [24];
  Variable *local_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 local_df8;
  undefined8 *local_df0;
  undefined8 local_de8;
  vector local_de0 [24];
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  unsigned_long *local_d70;
  unsigned_long *local_d68;
  unsigned_long *local_d60;
  unsigned_long *local_d58;
  vector local_d50 [24];
  vector local_d38 [24];
  Variable *local_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 local_c98;
  undefined8 *local_c90;
  undefined8 local_c88;
  vector local_c80 [24];
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  unsigned_long *local_c10;
  unsigned_long *local_c08;
  unsigned_long *local_c00;
  unsigned_long *local_bf8;
  vector local_bf0 [24];
  vector local_bd8 [24];
  Variable *local_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 local_b38;
  undefined8 *local_b30;
  undefined8 local_b28;
  vector local_b20 [24];
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  unsigned_long *local_ab0;
  unsigned_long *local_aa8;
  unsigned_long *local_aa0;
  unsigned_long *local_a98;
  vector local_a90 [24];
  vector local_a78 [24];
  Variable *local_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 local_9d8;
  undefined8 *local_9d0;
  undefined8 local_9c8;
  vector local_9c0 [24];
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  unsigned_long *local_950;
  unsigned_long *local_948;
  unsigned_long *local_940;
  unsigned_long *local_938;
  vector local_930 [24];
  vector local_918 [24];
  Variable *local_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 *local_870;
  undefined8 local_868;
  vector local_860 [24];
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  unsigned_long *local_7f0;
  unsigned_long *local_7e8;
  unsigned_long *local_7e0;
  unsigned_long *local_7d8;
  vector local_7d0 [24];
  vector local_7b8 [24];
  Variable *local_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 local_718;
  undefined8 *local_710;
  undefined8 local_708;
  vector local_700 [24];
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  unsigned_long *local_690;
  unsigned_long *local_688;
  unsigned_long *local_680;
  unsigned_long *local_678;
  vector local_670 [24];
  vector local_658 [24];
  Variable *local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 local_5b8;
  undefined8 *local_5b0;
  undefined8 local_5a8;
  vector local_5a0 [24];
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  unsigned_long *local_530;
  unsigned_long *local_528;
  unsigned_long *local_520;
  unsigned_long *local_518;
  vector local_510 [24];
  vector local_4f8 [24];
  Variable *local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 *local_450;
  undefined8 local_448;
  vector local_440 [24];
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  unsigned_long *local_3d0;
  unsigned_long *local_3c8;
  unsigned_long *local_3c0;
  unsigned_long *local_3b8;
  vector local_3b0 [24];
  vector local_398 [24];
  Variable *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 local_2f8;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  vector local_2e0 [24];
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  unsigned_long *local_270;
  unsigned_long *local_268;
  unsigned_long *local_260;
  unsigned_long *local_258;
  vector local_250 [24];
  vector local_238 [24];
  Variable *local_220;
  string local_218 [32];
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_true>
  local_160;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_true>
  local_158;
  vector *local_150;
  unsigned_long *local_148;
  unsigned_long *local_140;
  unsigned_long *local_138;
  unsigned_long *local_130;
  vector local_128 [24];
  vector local_110 [24];
  long local_f8;
  byte local_eb;
  byte local_ea;
  allocator<char> local_e9;
  char *local_e8;
  char *local_e0;
  string local_d8 [39];
  allocator<char> local_b1 [31];
  byte local_92;
  allocator<char> local_91;
  char *local_90;
  char *local_88;
  string local_80 [55];
  allocator<char> local_49 [31];
  byte local_2a;
  byte local_29;
  string *local_28;
  StructDefinition *local_20;
  size_t *local_18;
  Buffer *local_8;
  
  local_29 = in_R9B & 1;
  *(undefined4 *)
   &in_RCX[1].m_Definition.
    super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
    ._M_impl.super__Vector_impl_data._M_finish = in_ESI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  pbVar4 = Buffer::operator[](in_RDI,*in_RDX);
  local_2a = *pbVar4;
  *local_18 = *local_18 + 1;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffdc50,
             (size_type)in_stack_ffffffffffffdc48,
             (allocator_type *)in_stack_ffffffffffffdc40._M_current);
  std::allocator<char>::~allocator(local_49);
  pcVar5 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1acce4);
  puVar6 = Buffer::data(local_8,*local_18);
  memcpy(pcVar5,puVar6,(ulong)local_2a);
  local_88 = (char *)std::vector<char,_std::allocator<char>_>::begin
                               ((vector<char,_std::allocator<char>_> *)
                                CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
  local_90 = (char *)std::vector<char,_std::allocator<char>_>::end
                               ((vector<char,_std::allocator<char>_> *)
                                CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            (in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc58,
             in_stack_ffffffffffffdc48);
  std::__cxx11::string::operator=((string *)local_20,local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_91);
  *local_18 = *local_18 + (ulong)local_2a;
  pbVar4 = Buffer::operator[](local_8,*local_18);
  *(uint *)&local_20->m_StructSize = (uint)*pbVar4;
  *local_18 = *local_18 + 1;
  if ((int)local_20->m_StructSize == 0x10) {
    local_92 = Buffer::value<unsigned_char>(local_8,*local_18);
    *local_18 = *local_18 + 1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffdc50,
               (size_type)in_stack_ffffffffffffdc48,
               (allocator_type *)in_stack_ffffffffffffdc40._M_current);
    std::allocator<char>::~allocator(local_b1);
    pcVar5 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1acee7);
    puVar6 = Buffer::data(local_8,*local_18);
    memcpy(pcVar5,puVar6,(ulong)local_92);
    *local_18 = *local_18 + (ulong)local_92;
    local_e0 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                 ((vector<char,_std::allocator<char>_> *)
                                  CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
    local_e8 = (char *)std::vector<char,_std::allocator<char>_>::end
                                 ((vector<char,_std::allocator<char>_> *)
                                  CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              (in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc58,
               in_stack_ffffffffffffdc48);
    std::__cxx11::string::operator=((string *)&local_20->m_Name,local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_e9);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffdc40._M_current);
  }
  pSVar7 = (pointer)Buffer::value<unsigned_long>(local_8,*local_18);
  local_20[1].m_Definition.
  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = pSVar7;
  *local_18 = *local_18 + 8;
  pbVar4 = Buffer::operator[](local_8,*local_18);
  local_ea = *pbVar4;
  *local_18 = *local_18 + 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffdc50,
             (size_type)in_stack_ffffffffffffdc48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffdc50,
             (size_type)in_stack_ffffffffffffdc48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffdc50,
             (size_type)in_stack_ffffffffffffdc48);
  puVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ad1c9);
  puVar6 = Buffer::data(local_8,*local_18);
  memcpy(puVar8,puVar6,(ulong)local_ea << 3);
  *local_18 = *local_18 + (ulong)local_ea * 8;
  puVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ad242);
  puVar6 = Buffer::data(local_8,*local_18);
  memcpy(puVar8,puVar6,(ulong)local_ea << 3);
  *local_18 = *local_18 + (ulong)local_ea * 8;
  puVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ad2be);
  puVar6 = Buffer::data(local_8,*local_18);
  memcpy(puVar8,puVar6,(ulong)local_ea << 3);
  *local_18 = *local_18 + (ulong)local_ea * 8;
  uVar9 = Buffer::value<unsigned_long>(local_8,*local_18);
  local_20[2].m_StructSize = uVar9;
  *local_18 = *local_18 + 8;
  pSVar7 = (pointer)Buffer::value<unsigned_long>(local_8,*local_18);
  local_20[3].m_Definition.
  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = pSVar7;
  *local_18 = *local_18 + 8;
  pbVar4 = Buffer::operator[](local_8,*local_18);
  local_eb = *pbVar4;
  *local_18 = *local_18 + 1;
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffdc50,
             (size_type)in_stack_ffffffffffffdc48);
  if (local_eb != 0) {
    pcVar5 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1ad441);
    puVar6 = Buffer::data(local_8,0);
    memcpy(pcVar5,puVar6 + *local_18,(ulong)local_eb);
    *local_18 = (ulong)local_eb + *local_18;
  }
  if ((local_29 & 1) != 0) {
    if ((int)local_20->m_StructSize == 0x10) {
      local_f8 = adios2::core::IO::InquireStructVariable(local_28);
      if (local_f8 == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffdc80,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffdc78);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffdc80,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffdc78);
        if (*(int *)(local_28 + 0x58) != 0) {
          local_130 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
          local_138 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
          std::
          reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
          local_140 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
          local_148 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
          std::
          reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
        }
        if (*(int *)&local_20[1].m_Definition.
                     super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                     ._M_impl.super__Vector_impl_data._M_finish == 2) {
          local_150 = (vector *)0x0;
          local_158._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
                       *)CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28),
                      (key_type *)0x1ad637);
          local_160._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
                      *)CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
          bVar2 = std::__detail::operator!=(&local_158,&local_160);
          if (bVar2) {
            ppVar10 = std::__detail::
                      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_false,_true>
                      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_false,_true>
                                    *)0x1ad68e);
            local_150 = (vector *)&ppVar10->second;
          }
          if (local_150 == (vector *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_180,"Engine",&local_181);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1a8,"SscHelper",&local_1a9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1d0,"DeserializeVariable",&local_1d1);
            std::operator+((char *)in_stack_ffffffffffffdc78,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffdc74,in_stack_ffffffffffffdc70));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffdc38._M_current,in_stack_ffffffffffffdc30);
            helper::Throw<std::runtime_error>
                      (in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88,in_stack_ffffffffffffdc80
                       ,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc74);
            std::__cxx11::string::~string(local_1f8);
            std::__cxx11::string::~string(local_218);
            std::__cxx11::string::~string(local_1d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
            std::__cxx11::string::~string(local_1a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
            std::__cxx11::string::~string(local_180);
            std::allocator<char>::~allocator((allocator<char> *)&local_181);
          }
          else {
            adios2::core::IO::DefineStructVariable
                      (local_28,local_20,local_150,local_128,local_110,SUB81(local_128,0));
          }
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffdc40._M_current);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffdc40._M_current);
      }
    }
    else {
      sVar1 = local_20->m_StructSize;
      DVar3 = helper::GetDataType<std::__cxx11::string>();
      if ((DataType)sVar1 == DVar3) {
        local_220 = adios2::core::IO::InquireVariable<std::__cxx11::string>(local_28);
        if (local_220 == (Variable *)0x0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffdc80,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffdc78);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffdc80,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffdc78);
          if (*(int *)(local_28 + 0x58) != 0) {
            local_258 = (unsigned_long *)
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
            local_260 = (unsigned_long *)
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
            std::
            reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
            local_268 = (unsigned_long *)
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
            local_270 = (unsigned_long *)
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
            std::
            reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
          }
          if (*(int *)&local_20[1].m_Definition.
                       super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                       ._M_impl.super__Vector_impl_data._M_finish == 1) {
            local_288 = 0;
            uStack_280 = 0;
            local_278 = 0;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1adb55);
            local_2a8 = 0;
            uStack_2a0 = 0;
            local_298 = 0;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1adb86);
            local_2c8 = 0;
            uStack_2c0 = 0;
            local_2b8 = 0;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1adbb7);
            adios2::core::IO::DefineVariable<std::__cxx11::string>
                      (local_28,(vector *)local_20,(vector *)&local_288,(vector *)&local_2a8,
                       SUB81(&local_2c8,0));
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc40._M_current);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc40._M_current);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc40._M_current);
          }
          else if (*(int *)&local_20[1].m_Definition.
                            super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                            ._M_impl.super__Vector_impl_data._M_finish == 2) {
            adios2::core::IO::DefineVariable<std::__cxx11::string>
                      (local_28,(vector *)local_20,local_250,local_238,SUB81(local_250,0));
          }
          else if (*(int *)&local_20[1].m_Definition.
                            super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                            ._M_impl.super__Vector_impl_data._M_finish == 4) {
            local_2f8 = 0xfffffffffffffffd;
            local_2f0 = &local_2f8;
            local_2e8 = 1;
            std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1add04);
            __l._M_len._0_4_ = in_stack_ffffffffffffdc70;
            __l._M_array = (iterator)in_stack_ffffffffffffdc68;
            __l._M_len._4_4_ = in_stack_ffffffffffffdc74;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc60._M_current,__l,
                       (allocator_type *)in_stack_ffffffffffffdc58._M_current);
            local_318 = 0;
            uStack_310 = 0;
            local_308 = 0;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1add5f);
            local_338 = 0;
            uStack_330 = 0;
            local_328 = 0;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1add90);
            adios2::core::IO::DefineVariable<std::__cxx11::string>
                      (local_28,(vector *)local_20,local_2e0,(vector *)&local_318,
                       SUB81(&local_338,0));
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc40._M_current);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc40._M_current);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc40._M_current);
            std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1addf6);
          }
          else if (*(int *)&local_20[1].m_Definition.
                            super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                            ._M_impl.super__Vector_impl_data._M_finish == 5) {
            local_358 = 0;
            uStack_350 = 0;
            local_348 = 0;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1adec4);
            local_378 = 0;
            uStack_370 = 0;
            local_368 = 0;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1adef5);
            adios2::core::IO::DefineVariable<std::__cxx11::string>
                      (local_28,(vector *)local_20,(vector *)&local_358,(vector *)&local_378,
                       SUB81(local_250,0));
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc40._M_current);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc40._M_current);
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffdc40._M_current);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffdc40._M_current);
        }
      }
      else {
        sVar1 = local_20->m_StructSize;
        DVar3 = helper::GetDataType<char>();
        if ((DataType)sVar1 == DVar3) {
          local_380 = adios2::core::IO::InquireVariable<char>(local_28);
          if (local_380 == (Variable *)0x0) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc80,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc78);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc80,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc78);
            if (*(int *)(local_28 + 0x58) != 0) {
              local_3b8 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
              local_3c0 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
              std::
              reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
              local_3c8 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
              local_3d0 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28));
              std::
              reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
            }
            if (*(int *)&local_20[1].m_Definition.
                         super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                         ._M_impl.super__Vector_impl_data._M_finish == 1) {
              local_3e8 = 0;
              uStack_3e0 = 0;
              local_3d8 = 0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae181);
              local_408 = 0;
              uStack_400 = 0;
              local_3f8 = 0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae1b2);
              local_428 = 0;
              uStack_420 = 0;
              local_418 = 0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae1e3);
              adios2::core::IO::DefineVariable<char>
                        (local_28,(vector *)local_20,(vector *)&local_3e8,(vector *)&local_408,
                         SUB81(&local_428,0));
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc40._M_current);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc40._M_current);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc40._M_current);
            }
            else if (*(int *)&local_20[1].m_Definition.
                              super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                              ._M_impl.super__Vector_impl_data._M_finish == 2) {
              adios2::core::IO::DefineVariable<char>
                        (local_28,(vector *)local_20,local_3b0,local_398,SUB81(local_3b0,0));
            }
            else if (*(int *)&local_20[1].m_Definition.
                              super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                              ._M_impl.super__Vector_impl_data._M_finish == 4) {
              local_458 = 0xfffffffffffffffd;
              local_450 = &local_458;
              local_448 = 1;
              std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1ae330);
              __l_00._M_len._0_4_ = in_stack_ffffffffffffdc70;
              __l_00._M_array = (iterator)in_stack_ffffffffffffdc68;
              __l_00._M_len._4_4_ = in_stack_ffffffffffffdc74;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc60._M_current,__l_00,
                         (allocator_type *)in_stack_ffffffffffffdc58._M_current);
              local_478 = 0;
              uStack_470 = 0;
              local_468 = 0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae38b);
              local_498 = 0;
              uStack_490 = 0;
              local_488 = 0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae3bc);
              adios2::core::IO::DefineVariable<char>
                        (local_28,(vector *)local_20,local_440,(vector *)&local_478,
                         SUB81(&local_498,0));
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc40._M_current);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc40._M_current);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc40._M_current);
              std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1ae422);
            }
            else if (*(int *)&local_20[1].m_Definition.
                              super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                              ._M_impl.super__Vector_impl_data._M_finish == 5) {
              local_4b8 = 0;
              uStack_4b0 = 0;
              local_4a8 = 0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae4f0);
              local_4d8 = 0;
              uStack_4d0 = 0;
              local_4c8 = 0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae521);
              adios2::core::IO::DefineVariable<char>
                        (local_28,(vector *)local_20,(vector *)&local_4b8,(vector *)&local_4d8,
                         SUB81(local_3b0,0));
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc40._M_current);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc40._M_current);
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc40._M_current);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffdc40._M_current);
          }
        }
        else {
          sVar1 = local_20->m_StructSize;
          DVar3 = helper::GetDataType<signed_char>();
          if ((DataType)sVar1 == DVar3) {
            local_4e0 = adios2::core::IO::InquireVariable<signed_char>(local_28);
            if (local_4e0 == (Variable *)0x0) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc80,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc78);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc80,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc78);
              if (*(int *)(local_28 + 0x58) != 0) {
                local_518 = (unsigned_long *)
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28)
                                      );
                local_520 = (unsigned_long *)
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28)
                                      );
                std::
                reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                          (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                local_528 = (unsigned_long *)
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28)
                                      );
                local_530 = (unsigned_long *)
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28)
                                      );
                std::
                reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                          (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
              }
              if (*(int *)&local_20[1].m_Definition.
                           super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                           ._M_impl.super__Vector_impl_data._M_finish == 1) {
                local_548 = 0;
                uStack_540 = 0;
                local_538 = 0;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae7ad);
                local_568 = 0;
                uStack_560 = 0;
                local_558 = 0;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae7de);
                local_588 = 0;
                uStack_580 = 0;
                local_578 = 0;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae80f);
                adios2::core::IO::DefineVariable<signed_char>
                          (local_28,(vector *)local_20,(vector *)&local_548,(vector *)&local_568,
                           SUB81(&local_588,0));
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc40._M_current);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc40._M_current);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc40._M_current);
              }
              else if (*(int *)&local_20[1].m_Definition.
                                super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                ._M_impl.super__Vector_impl_data._M_finish == 2) {
                adios2::core::IO::DefineVariable<signed_char>
                          (local_28,(vector *)local_20,local_510,local_4f8,SUB81(local_510,0));
              }
              else if (*(int *)&local_20[1].m_Definition.
                                super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                ._M_impl.super__Vector_impl_data._M_finish == 4) {
                local_5b8 = 0xfffffffffffffffd;
                local_5b0 = &local_5b8;
                local_5a8 = 1;
                std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1ae95c);
                __l_01._M_len._0_4_ = in_stack_ffffffffffffdc70;
                __l_01._M_array = (iterator)in_stack_ffffffffffffdc68;
                __l_01._M_len._4_4_ = in_stack_ffffffffffffdc74;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc60._M_current,__l_01,
                           (allocator_type *)in_stack_ffffffffffffdc58._M_current);
                local_5d8 = 0;
                uStack_5d0 = 0;
                local_5c8 = 0;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae9b7);
                local_5f8 = 0;
                uStack_5f0 = 0;
                local_5e8 = 0;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae9e8);
                adios2::core::IO::DefineVariable<signed_char>
                          (local_28,(vector *)local_20,local_5a0,(vector *)&local_5d8,
                           SUB81(&local_5f8,0));
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc40._M_current);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc40._M_current);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc40._M_current);
                std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1aea4e);
              }
              else if (*(int *)&local_20[1].m_Definition.
                                super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                ._M_impl.super__Vector_impl_data._M_finish == 5) {
                local_618 = 0;
                uStack_610 = 0;
                local_608 = 0;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1aeb1c);
                local_638 = 0;
                uStack_630 = 0;
                local_628 = 0;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1aeb4d);
                adios2::core::IO::DefineVariable<signed_char>
                          (local_28,(vector *)local_20,(vector *)&local_618,(vector *)&local_638,
                           SUB81(local_510,0));
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc40._M_current);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc40._M_current);
              }
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc40._M_current);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffdc40._M_current);
            }
          }
          else {
            sVar1 = local_20->m_StructSize;
            DVar3 = helper::GetDataType<short>();
            if ((DataType)sVar1 == DVar3) {
              local_640 = adios2::core::IO::InquireVariable<short>(local_28);
              if (local_640 == (Variable *)0x0) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc80,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc78);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc80,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc78);
                if (*(int *)(local_28 + 0x58) != 0) {
                  local_678 = (unsigned_long *)
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         CONCAT44(in_stack_ffffffffffffdc2c,
                                                  in_stack_ffffffffffffdc28));
                  local_680 = (unsigned_long *)
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         CONCAT44(in_stack_ffffffffffffdc2c,
                                                  in_stack_ffffffffffffdc28));
                  std::
                  reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                  local_688 = (unsigned_long *)
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         CONCAT44(in_stack_ffffffffffffdc2c,
                                                  in_stack_ffffffffffffdc28));
                  local_690 = (unsigned_long *)
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         CONCAT44(in_stack_ffffffffffffdc2c,
                                                  in_stack_ffffffffffffdc28));
                  std::
                  reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                }
                if (*(int *)&local_20[1].m_Definition.
                             super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                             ._M_impl.super__Vector_impl_data._M_finish == 1) {
                  local_6a8 = 0;
                  uStack_6a0 = 0;
                  local_698 = 0;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1aedd9);
                  local_6c8 = 0;
                  uStack_6c0 = 0;
                  local_6b8 = 0;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1aee0a);
                  local_6e8 = 0;
                  uStack_6e0 = 0;
                  local_6d8 = 0;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1aee3b);
                  adios2::core::IO::DefineVariable<short>
                            (local_28,(vector *)local_20,(vector *)&local_6a8,(vector *)&local_6c8,
                             SUB81(&local_6e8,0));
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc40._M_current);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc40._M_current);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc40._M_current);
                }
                else if (*(int *)&local_20[1].m_Definition.
                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish == 2) {
                  adios2::core::IO::DefineVariable<short>
                            (local_28,(vector *)local_20,local_670,local_658,SUB81(local_670,0));
                }
                else if (*(int *)&local_20[1].m_Definition.
                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish == 4) {
                  local_718 = 0xfffffffffffffffd;
                  local_710 = &local_718;
                  local_708 = 1;
                  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1aef88);
                  __l_02._M_len._0_4_ = in_stack_ffffffffffffdc70;
                  __l_02._M_array = (iterator)in_stack_ffffffffffffdc68;
                  __l_02._M_len._4_4_ = in_stack_ffffffffffffdc74;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc60._M_current,__l_02,
                             (allocator_type *)in_stack_ffffffffffffdc58._M_current);
                  local_738 = 0;
                  uStack_730 = 0;
                  local_728 = 0;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1aefe3);
                  local_758 = 0;
                  uStack_750 = 0;
                  local_748 = 0;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1af014);
                  adios2::core::IO::DefineVariable<short>
                            (local_28,(vector *)local_20,local_700,(vector *)&local_738,
                             SUB81(&local_758,0));
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc40._M_current);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc40._M_current);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc40._M_current);
                  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1af07a);
                }
                else if (*(int *)&local_20[1].m_Definition.
                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish == 5) {
                  local_778 = 0;
                  uStack_770 = 0;
                  local_768 = 0;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1af148);
                  local_798 = 0;
                  uStack_790 = 0;
                  local_788 = 0;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1af179);
                  adios2::core::IO::DefineVariable<short>
                            (local_28,(vector *)local_20,(vector *)&local_778,(vector *)&local_798,
                             SUB81(local_670,0));
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc40._M_current);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc40._M_current);
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc40._M_current);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffdc40._M_current);
              }
            }
            else {
              sVar1 = local_20->m_StructSize;
              DVar3 = helper::GetDataType<int>();
              if ((DataType)sVar1 == DVar3) {
                local_7a0 = adios2::core::IO::InquireVariable<int>(local_28);
                if (local_7a0 == (Variable *)0x0) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc80,
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc78);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc80,
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc78);
                  if (*(int *)(local_28 + 0x58) != 0) {
                    local_7d8 = (unsigned_long *)
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           CONCAT44(in_stack_ffffffffffffdc2c,
                                                    in_stack_ffffffffffffdc28));
                    local_7e0 = (unsigned_long *)
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           CONCAT44(in_stack_ffffffffffffdc2c,
                                                    in_stack_ffffffffffffdc28));
                    std::
                    reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                    local_7e8 = (unsigned_long *)
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           CONCAT44(in_stack_ffffffffffffdc2c,
                                                    in_stack_ffffffffffffdc28));
                    local_7f0 = (unsigned_long *)
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           CONCAT44(in_stack_ffffffffffffdc2c,
                                                    in_stack_ffffffffffffdc28));
                    std::
                    reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                  }
                  if (*(int *)&local_20[1].m_Definition.
                               super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                               ._M_impl.super__Vector_impl_data._M_finish == 1) {
                    local_808 = 0;
                    uStack_800 = 0;
                    local_7f8 = 0;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1af405);
                    local_828 = 0;
                    uStack_820 = 0;
                    local_818 = 0;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1af436);
                    local_848 = 0;
                    uStack_840 = 0;
                    local_838 = 0;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1af467);
                    adios2::core::IO::DefineVariable<int>
                              (local_28,(vector *)local_20,(vector *)&local_808,(vector *)&local_828
                               ,SUB81(&local_848,0));
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc40._M_current);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc40._M_current);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc40._M_current);
                  }
                  else if (*(int *)&local_20[1].m_Definition.
                                    super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                    ._M_impl.super__Vector_impl_data._M_finish == 2) {
                    adios2::core::IO::DefineVariable<int>
                              (local_28,(vector *)local_20,local_7d0,local_7b8,SUB81(local_7d0,0));
                  }
                  else if (*(int *)&local_20[1].m_Definition.
                                    super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                    ._M_impl.super__Vector_impl_data._M_finish == 4) {
                    local_878 = 0xfffffffffffffffd;
                    local_870 = &local_878;
                    local_868 = 1;
                    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1af5b4);
                    __l_03._M_len._0_4_ = in_stack_ffffffffffffdc70;
                    __l_03._M_array = (iterator)in_stack_ffffffffffffdc68;
                    __l_03._M_len._4_4_ = in_stack_ffffffffffffdc74;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc60._M_current,__l_03,
                               (allocator_type *)in_stack_ffffffffffffdc58._M_current);
                    local_898 = 0;
                    uStack_890 = 0;
                    local_888 = 0;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1af60f);
                    local_8b8 = 0;
                    uStack_8b0 = 0;
                    local_8a8 = 0;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1af640);
                    adios2::core::IO::DefineVariable<int>
                              (local_28,(vector *)local_20,local_860,(vector *)&local_898,
                               SUB81(&local_8b8,0));
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc40._M_current);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc40._M_current);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc40._M_current);
                    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1af6a6);
                  }
                  else if (*(int *)&local_20[1].m_Definition.
                                    super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                    ._M_impl.super__Vector_impl_data._M_finish == 5) {
                    local_8d8 = 0;
                    uStack_8d0 = 0;
                    local_8c8 = 0;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1af774);
                    local_8f8 = 0;
                    uStack_8f0 = 0;
                    local_8e8 = 0;
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1af7a5);
                    adios2::core::IO::DefineVariable<int>
                              (local_28,(vector *)local_20,(vector *)&local_8d8,(vector *)&local_8f8
                               ,SUB81(local_7d0,0));
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc40._M_current);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc40._M_current);
                  }
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc40._M_current);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_ffffffffffffdc40._M_current);
                }
              }
              else {
                sVar1 = local_20->m_StructSize;
                DVar3 = helper::GetDataType<long>();
                if ((DataType)sVar1 == DVar3) {
                  local_900 = adios2::core::IO::InquireVariable<long>(local_28);
                  if (local_900 == (Variable *)0x0) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc80,
                               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc78);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc80,
                               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc78);
                    if (*(int *)(local_28 + 0x58) != 0) {
                      local_938 = (unsigned_long *)
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                         in_stack_ffffffffffffdc28));
                      local_940 = (unsigned_long *)
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                         in_stack_ffffffffffffdc28));
                      std::
                      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                      local_948 = (unsigned_long *)
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                         in_stack_ffffffffffffdc28));
                      local_950 = (unsigned_long *)
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                         in_stack_ffffffffffffdc28));
                      std::
                      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                    }
                    if (*(int *)&local_20[1].m_Definition.
                                 super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                 ._M_impl.super__Vector_impl_data._M_finish == 1) {
                      local_968 = 0;
                      uStack_960 = 0;
                      local_958 = 0;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1afa31);
                      local_988 = 0;
                      uStack_980 = 0;
                      local_978 = 0;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1afa62);
                      local_9a8 = 0;
                      uStack_9a0 = 0;
                      local_998 = 0;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1afa93);
                      adios2::core::IO::DefineVariable<long>
                                (local_28,(vector *)local_20,(vector *)&local_968,
                                 (vector *)&local_988,SUB81(&local_9a8,0));
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc40._M_current);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc40._M_current);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc40._M_current);
                    }
                    else if (*(int *)&local_20[1].m_Definition.
                                      super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == 2) {
                      adios2::core::IO::DefineVariable<long>
                                (local_28,(vector *)local_20,local_930,local_918,SUB81(local_930,0))
                      ;
                    }
                    else if (*(int *)&local_20[1].m_Definition.
                                      super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == 4) {
                      local_9d8 = 0xfffffffffffffffd;
                      local_9d0 = &local_9d8;
                      local_9c8 = 1;
                      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1afbe0)
                      ;
                      __l_04._M_len._0_4_ = in_stack_ffffffffffffdc70;
                      __l_04._M_array = (iterator)in_stack_ffffffffffffdc68;
                      __l_04._M_len._4_4_ = in_stack_ffffffffffffdc74;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc60._M_current,__l_04,
                                 (allocator_type *)in_stack_ffffffffffffdc58._M_current);
                      local_9f8 = 0;
                      uStack_9f0 = 0;
                      local_9e8 = 0;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1afc3b);
                      local_a18 = 0;
                      uStack_a10 = 0;
                      local_a08 = 0;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1afc6c);
                      adios2::core::IO::DefineVariable<long>
                                (local_28,(vector *)local_20,local_9c0,(vector *)&local_9f8,
                                 SUB81(&local_a18,0));
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc40._M_current);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc40._M_current);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc40._M_current);
                      std::allocator<unsigned_long>::~allocator
                                ((allocator<unsigned_long> *)0x1afcd2);
                    }
                    else if (*(int *)&local_20[1].m_Definition.
                                      super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == 5) {
                      local_a38 = 0;
                      uStack_a30 = 0;
                      local_a28 = 0;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1afda0);
                      local_a58 = 0;
                      uStack_a50 = 0;
                      local_a48 = 0;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1afdd1);
                      adios2::core::IO::DefineVariable<long>
                                (local_28,(vector *)local_20,(vector *)&local_a38,
                                 (vector *)&local_a58,SUB81(local_930,0));
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc40._M_current);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc40._M_current);
                    }
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc40._M_current);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_ffffffffffffdc40._M_current);
                  }
                }
                else {
                  sVar1 = local_20->m_StructSize;
                  DVar3 = helper::GetDataType<unsigned_char>();
                  if ((DataType)sVar1 == DVar3) {
                    local_a60 = adios2::core::IO::InquireVariable<unsigned_char>(local_28);
                    if (local_a60 == (Variable *)0x0) {
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc80,
                                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc78);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc80,
                                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc78);
                      if (*(int *)(local_28 + 0x58) != 0) {
                        local_a98 = (unsigned_long *)
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    begin((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          CONCAT44(in_stack_ffffffffffffdc2c,
                                                   in_stack_ffffffffffffdc28));
                        local_aa0 = (unsigned_long *)
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                              ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                           in_stack_ffffffffffffdc28));
                        std::
                        reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                  (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                        local_aa8 = (unsigned_long *)
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    begin((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          CONCAT44(in_stack_ffffffffffffdc2c,
                                                   in_stack_ffffffffffffdc28));
                        local_ab0 = (unsigned_long *)
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                              ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                           in_stack_ffffffffffffdc28));
                        std::
                        reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                  (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                      }
                      if (*(int *)&local_20[1].m_Definition.
                                   super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                   ._M_impl.super__Vector_impl_data._M_finish == 1) {
                        local_ac8 = 0;
                        uStack_ac0 = 0;
                        local_ab8 = 0;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b005d
                                  );
                        local_ae8 = 0;
                        uStack_ae0 = 0;
                        local_ad8 = 0;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b008e
                                  );
                        local_b08 = 0;
                        uStack_b00 = 0;
                        local_af8 = 0;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b00bf
                                  );
                        adios2::core::IO::DefineVariable<unsigned_char>
                                  (local_28,(vector *)local_20,(vector *)&local_ac8,
                                   (vector *)&local_ae8,SUB81(&local_b08,0));
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc40._M_current);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc40._M_current);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc40._M_current);
                      }
                      else if (*(int *)&local_20[1].m_Definition.
                                        super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                        ._M_impl.super__Vector_impl_data._M_finish == 2) {
                        adios2::core::IO::DefineVariable<unsigned_char>
                                  (local_28,(vector *)local_20,local_a90,local_a78,
                                   SUB81(local_a90,0));
                      }
                      else if (*(int *)&local_20[1].m_Definition.
                                        super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                        ._M_impl.super__Vector_impl_data._M_finish == 4) {
                        local_b38 = 0xfffffffffffffffd;
                        local_b30 = &local_b38;
                        local_b28 = 1;
                        std::allocator<unsigned_long>::allocator
                                  ((allocator<unsigned_long> *)0x1b020c);
                        __l_05._M_len._0_4_ = in_stack_ffffffffffffdc70;
                        __l_05._M_array = (iterator)in_stack_ffffffffffffdc68;
                        __l_05._M_len._4_4_ = in_stack_ffffffffffffdc74;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc60._M_current,__l_05,
                                   (allocator_type *)in_stack_ffffffffffffdc58._M_current);
                        local_b58 = 0;
                        uStack_b50 = 0;
                        local_b48 = 0;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b0267
                                  );
                        local_b78 = 0;
                        uStack_b70 = 0;
                        local_b68 = 0;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b0298
                                  );
                        adios2::core::IO::DefineVariable<unsigned_char>
                                  (local_28,(vector *)local_20,local_b20,(vector *)&local_b58,
                                   SUB81(&local_b78,0));
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc40._M_current);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc40._M_current);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc40._M_current);
                        std::allocator<unsigned_long>::~allocator
                                  ((allocator<unsigned_long> *)0x1b02fe);
                      }
                      else if (*(int *)&local_20[1].m_Definition.
                                        super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                        ._M_impl.super__Vector_impl_data._M_finish == 5) {
                        local_b98 = 0;
                        uStack_b90 = 0;
                        local_b88 = 0;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b03cc
                                  );
                        local_bb8 = 0;
                        uStack_bb0 = 0;
                        local_ba8 = 0;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b03fd
                                  );
                        adios2::core::IO::DefineVariable<unsigned_char>
                                  (local_28,(vector *)local_20,(vector *)&local_b98,
                                   (vector *)&local_bb8,SUB81(local_a90,0));
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc40._M_current);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc40._M_current);
                      }
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc40._M_current);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_ffffffffffffdc40._M_current);
                    }
                  }
                  else {
                    sVar1 = local_20->m_StructSize;
                    DVar3 = helper::GetDataType<unsigned_short>();
                    if ((DataType)sVar1 == DVar3) {
                      local_bc0 = adios2::core::IO::InquireVariable<unsigned_short>(local_28);
                      if (local_bc0 == (Variable *)0x0) {
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc80,
                                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc78);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc80,
                                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc78);
                        if (*(int *)(local_28 + 0x58) != 0) {
                          local_bf8 = (unsigned_long *)
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      begin((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )CONCAT44(in_stack_ffffffffffffdc2c,
                                                      in_stack_ffffffffffffdc28));
                          local_c00 = (unsigned_long *)
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      end((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          CONCAT44(in_stack_ffffffffffffdc2c,
                                                   in_stack_ffffffffffffdc28));
                          std::
                          reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                          local_c08 = (unsigned_long *)
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      begin((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )CONCAT44(in_stack_ffffffffffffdc2c,
                                                      in_stack_ffffffffffffdc28));
                          local_c10 = (unsigned_long *)
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      end((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          CONCAT44(in_stack_ffffffffffffdc2c,
                                                   in_stack_ffffffffffffdc28));
                          std::
                          reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                        }
                        if (*(int *)&local_20[1].m_Definition.
                                     super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_finish == 1) {
                          local_c28 = 0;
                          uStack_c20 = 0;
                          local_c18 = 0;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     0x1b0689);
                          local_c48 = 0;
                          uStack_c40 = 0;
                          local_c38 = 0;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     0x1b06ba);
                          local_c68 = 0;
                          uStack_c60 = 0;
                          local_c58 = 0;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     0x1b06eb);
                          adios2::core::IO::DefineVariable<unsigned_short>
                                    (local_28,(vector *)local_20,(vector *)&local_c28,
                                     (vector *)&local_c48,SUB81(&local_c68,0));
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc40._M_current);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc40._M_current);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc40._M_current);
                        }
                        else if (*(int *)&local_20[1].m_Definition.
                                          super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                          ._M_impl.super__Vector_impl_data._M_finish == 2) {
                          adios2::core::IO::DefineVariable<unsigned_short>
                                    (local_28,(vector *)local_20,local_bf0,local_bd8,
                                     SUB81(local_bf0,0));
                        }
                        else if (*(int *)&local_20[1].m_Definition.
                                          super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                          ._M_impl.super__Vector_impl_data._M_finish == 4) {
                          local_c98 = 0xfffffffffffffffd;
                          local_c90 = &local_c98;
                          local_c88 = 1;
                          std::allocator<unsigned_long>::allocator
                                    ((allocator<unsigned_long> *)0x1b0838);
                          __l_06._M_len._0_4_ = in_stack_ffffffffffffdc70;
                          __l_06._M_array = (iterator)in_stack_ffffffffffffdc68;
                          __l_06._M_len._4_4_ = in_stack_ffffffffffffdc74;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc60._M_current,__l_06,
                                     (allocator_type *)in_stack_ffffffffffffdc58._M_current);
                          local_cb8 = 0;
                          uStack_cb0 = 0;
                          local_ca8 = 0;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     0x1b0893);
                          local_cd8 = 0;
                          uStack_cd0 = 0;
                          local_cc8 = 0;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     0x1b08c4);
                          adios2::core::IO::DefineVariable<unsigned_short>
                                    (local_28,(vector *)local_20,local_c80,(vector *)&local_cb8,
                                     SUB81(&local_cd8,0));
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc40._M_current);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc40._M_current);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc40._M_current);
                          std::allocator<unsigned_long>::~allocator
                                    ((allocator<unsigned_long> *)0x1b092a);
                        }
                        else if (*(int *)&local_20[1].m_Definition.
                                          super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                          ._M_impl.super__Vector_impl_data._M_finish == 5) {
                          local_cf8 = 0;
                          uStack_cf0 = 0;
                          local_ce8 = 0;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     0x1b09f8);
                          local_d18 = 0;
                          uStack_d10 = 0;
                          local_d08 = 0;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     0x1b0a29);
                          adios2::core::IO::DefineVariable<unsigned_short>
                                    (local_28,(vector *)local_20,(vector *)&local_cf8,
                                     (vector *)&local_d18,SUB81(local_bf0,0));
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc40._M_current);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc40._M_current);
                        }
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc40._M_current);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_ffffffffffffdc40._M_current);
                      }
                    }
                    else {
                      sVar1 = local_20->m_StructSize;
                      DVar3 = helper::GetDataType<unsigned_int>();
                      if ((DataType)sVar1 == DVar3) {
                        local_d20 = adios2::core::IO::InquireVariable<unsigned_int>(local_28);
                        if (local_d20 == (Variable *)0x0) {
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc80,
                                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc78);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc80,
                                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc78);
                          if (*(int *)(local_28 + 0x58) != 0) {
                            local_d58 = (unsigned_long *)
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        begin((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                          in_stack_ffffffffffffdc28));
                            local_d60 = (unsigned_long *)
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        end((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )CONCAT44(in_stack_ffffffffffffdc2c,
                                                      in_stack_ffffffffffffdc28));
                            std::
                            reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                      (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                            local_d68 = (unsigned_long *)
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        begin((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                          in_stack_ffffffffffffdc28));
                            local_d70 = (unsigned_long *)
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        end((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )CONCAT44(in_stack_ffffffffffffdc2c,
                                                      in_stack_ffffffffffffdc28));
                            std::
                            reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                      (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                          }
                          if (*(int *)&local_20[1].m_Definition.
                                       super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                       ._M_impl.super__Vector_impl_data._M_finish == 1) {
                            local_d88 = 0;
                            uStack_d80 = 0;
                            local_d78 = 0;
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       0x1b0cb5);
                            local_da8 = 0;
                            uStack_da0 = 0;
                            local_d98 = 0;
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       0x1b0ce6);
                            local_dc8 = 0;
                            uStack_dc0 = 0;
                            local_db8 = 0;
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       0x1b0d17);
                            adios2::core::IO::DefineVariable<unsigned_int>
                                      (local_28,(vector *)local_20,(vector *)&local_d88,
                                       (vector *)&local_da8,SUB81(&local_dc8,0));
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc40._M_current);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc40._M_current);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc40._M_current);
                          }
                          else if (*(int *)&local_20[1].m_Definition.
                                            super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                            ._M_impl.super__Vector_impl_data._M_finish == 2) {
                            adios2::core::IO::DefineVariable<unsigned_int>
                                      (local_28,(vector *)local_20,local_d50,local_d38,
                                       SUB81(local_d50,0));
                          }
                          else if (*(int *)&local_20[1].m_Definition.
                                            super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                            ._M_impl.super__Vector_impl_data._M_finish == 4) {
                            local_df8 = 0xfffffffffffffffd;
                            local_df0 = &local_df8;
                            local_de8 = 1;
                            std::allocator<unsigned_long>::allocator
                                      ((allocator<unsigned_long> *)0x1b0e64);
                            __l_07._M_len._0_4_ = in_stack_ffffffffffffdc70;
                            __l_07._M_array = (iterator)in_stack_ffffffffffffdc68;
                            __l_07._M_len._4_4_ = in_stack_ffffffffffffdc74;
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc60._M_current,__l_07,
                                       (allocator_type *)in_stack_ffffffffffffdc58._M_current);
                            local_e18 = 0;
                            uStack_e10 = 0;
                            local_e08 = 0;
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       0x1b0ebf);
                            local_e38 = 0;
                            uStack_e30 = 0;
                            local_e28 = 0;
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       0x1b0ef0);
                            adios2::core::IO::DefineVariable<unsigned_int>
                                      (local_28,(vector *)local_20,local_de0,(vector *)&local_e18,
                                       SUB81(&local_e38,0));
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc40._M_current);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc40._M_current);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc40._M_current);
                            std::allocator<unsigned_long>::~allocator
                                      ((allocator<unsigned_long> *)0x1b0f56);
                          }
                          else if (*(int *)&local_20[1].m_Definition.
                                            super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                            ._M_impl.super__Vector_impl_data._M_finish == 5) {
                            local_e58 = 0;
                            uStack_e50 = 0;
                            local_e48 = 0;
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       0x1b1024);
                            local_e78 = 0;
                            uStack_e70 = 0;
                            local_e68 = 0;
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       0x1b1055);
                            adios2::core::IO::DefineVariable<unsigned_int>
                                      (local_28,(vector *)local_20,(vector *)&local_e58,
                                       (vector *)&local_e78,SUB81(local_d50,0));
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc40._M_current);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc40._M_current);
                          }
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc40._M_current);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_ffffffffffffdc40._M_current);
                        }
                      }
                      else {
                        sVar1 = local_20->m_StructSize;
                        DVar3 = helper::GetDataType<unsigned_long>();
                        if ((DataType)sVar1 == DVar3) {
                          local_e80 = adios2::core::IO::InquireVariable<unsigned_long>(local_28);
                          if (local_e80 == (Variable *)0x0) {
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc80,
                                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc78);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc80,
                                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc78);
                            if (*(int *)(local_28 + 0x58) != 0) {
                              local_eb8 = (unsigned_long *)
                                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                          ::begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                              local_ec0 = (unsigned_long *)
                                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                          ::end((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                            in_stack_ffffffffffffdc28));
                              std::
                              reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                              local_ec8 = (unsigned_long *)
                                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                          ::begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                              local_ed0 = (unsigned_long *)
                                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>
                                          ::end((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                            in_stack_ffffffffffffdc28));
                              std::
                              reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                            }
                            if (*(int *)&local_20[1].m_Definition.
                                         super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                         ._M_impl.super__Vector_impl_data._M_finish == 1) {
                              local_ee8 = 0;
                              uStack_ee0 = 0;
                              local_ed8 = 0;
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         0x1b12e1);
                              local_f08 = 0;
                              uStack_f00 = 0;
                              local_ef8 = 0;
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         0x1b1312);
                              local_f28 = 0;
                              uStack_f20 = 0;
                              local_f18 = 0;
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         0x1b1343);
                              adios2::core::IO::DefineVariable<unsigned_long>
                                        (local_28,(vector *)local_20,(vector *)&local_ee8,
                                         (vector *)&local_f08,SUB81(&local_f28,0));
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc40._M_current);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc40._M_current);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc40._M_current);
                            }
                            else if (*(int *)&local_20[1].m_Definition.
                                              super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                              ._M_impl.super__Vector_impl_data._M_finish == 2) {
                              adios2::core::IO::DefineVariable<unsigned_long>
                                        (local_28,(vector *)local_20,local_eb0,local_e98,
                                         SUB81(local_eb0,0));
                            }
                            else if (*(int *)&local_20[1].m_Definition.
                                              super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                              ._M_impl.super__Vector_impl_data._M_finish == 4) {
                              local_f58 = 0xfffffffffffffffd;
                              local_f50 = &local_f58;
                              local_f48 = 1;
                              std::allocator<unsigned_long>::allocator
                                        ((allocator<unsigned_long> *)0x1b1490);
                              __l_08._M_len._0_4_ = in_stack_ffffffffffffdc70;
                              __l_08._M_array = (iterator)in_stack_ffffffffffffdc68;
                              __l_08._M_len._4_4_ = in_stack_ffffffffffffdc74;
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc60._M_current,__l_08,
                                         (allocator_type *)in_stack_ffffffffffffdc58._M_current);
                              local_f78 = 0;
                              uStack_f70 = 0;
                              local_f68 = 0;
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         0x1b14eb);
                              local_f98 = 0;
                              uStack_f90 = 0;
                              local_f88 = 0;
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         0x1b151c);
                              adios2::core::IO::DefineVariable<unsigned_long>
                                        (local_28,(vector *)local_20,local_f40,(vector *)&local_f78,
                                         SUB81(&local_f98,0));
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc40._M_current);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc40._M_current);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc40._M_current);
                              std::allocator<unsigned_long>::~allocator
                                        ((allocator<unsigned_long> *)0x1b1582);
                            }
                            else if (*(int *)&local_20[1].m_Definition.
                                              super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                              ._M_impl.super__Vector_impl_data._M_finish == 5) {
                              local_fb8 = 0;
                              uStack_fb0 = 0;
                              local_fa8 = 0;
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         0x1b1650);
                              local_fd8 = 0;
                              uStack_fd0 = 0;
                              local_fc8 = 0;
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         0x1b1681);
                              adios2::core::IO::DefineVariable<unsigned_long>
                                        (local_28,(vector *)local_20,(vector *)&local_fb8,
                                         (vector *)&local_fd8,SUB81(local_eb0,0));
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc40._M_current);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc40._M_current);
                            }
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc40._M_current);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_ffffffffffffdc40._M_current);
                          }
                        }
                        else {
                          sVar1 = local_20->m_StructSize;
                          DVar3 = helper::GetDataType<float>();
                          if ((DataType)sVar1 == DVar3) {
                            local_fe0 = adios2::core::IO::InquireVariable<float>(local_28);
                            if (local_fe0 == (Variable *)0x0) {
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc80,
                                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc78);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc80,
                                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc78);
                              if (*(int *)(local_28 + 0x58) != 0) {
                                local_1018 = (unsigned_long *)
                                             std::
                                             vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                             begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                local_1020 = (unsigned_long *)
                                             std::
                                             vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                             end((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                std::
                                reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                          (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                                local_1028 = (unsigned_long *)
                                             std::
                                             vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                             begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                local_1030 = (unsigned_long *)
                                             std::
                                             vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                             end((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                std::
                                reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                          (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                              }
                              if (*(int *)&local_20[1].m_Definition.
                                           super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                           ._M_impl.super__Vector_impl_data._M_finish == 1) {
                                local_1048 = 0;
                                uStack_1040 = 0;
                                local_1038 = 0;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b190d);
                                local_1068 = 0;
                                uStack_1060 = 0;
                                local_1058 = 0;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b193e);
                                local_1088 = 0;
                                uStack_1080 = 0;
                                local_1078 = 0;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b196f);
                                adios2::core::IO::DefineVariable<float>
                                          (local_28,(vector *)local_20,(vector *)&local_1048,
                                           (vector *)&local_1068,SUB81(&local_1088,0));
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc40._M_current);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc40._M_current);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc40._M_current);
                              }
                              else if (*(int *)&local_20[1].m_Definition.
                                                super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                ._M_impl.super__Vector_impl_data._M_finish == 2) {
                                adios2::core::IO::DefineVariable<float>
                                          (local_28,(vector *)local_20,local_1010,local_ff8,
                                           SUB81(local_1010,0));
                              }
                              else if (*(int *)&local_20[1].m_Definition.
                                                super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                ._M_impl.super__Vector_impl_data._M_finish == 4) {
                                local_10b8 = 0xfffffffffffffffd;
                                local_10b0 = &local_10b8;
                                local_10a8 = 1;
                                std::allocator<unsigned_long>::allocator
                                          ((allocator<unsigned_long> *)0x1b1abc);
                                __l_09._M_len._0_4_ = in_stack_ffffffffffffdc70;
                                __l_09._M_array = (iterator)in_stack_ffffffffffffdc68;
                                __l_09._M_len._4_4_ = in_stack_ffffffffffffdc74;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc60._M_current,__l_09,
                                           (allocator_type *)in_stack_ffffffffffffdc58._M_current);
                                local_10d8 = 0;
                                uStack_10d0 = 0;
                                local_10c8 = 0;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b1b17);
                                local_10f8 = 0;
                                uStack_10f0 = 0;
                                local_10e8 = 0;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b1b48);
                                adios2::core::IO::DefineVariable<float>
                                          (local_28,(vector *)local_20,local_10a0,
                                           (vector *)&local_10d8,SUB81(&local_10f8,0));
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc40._M_current);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc40._M_current);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc40._M_current);
                                std::allocator<unsigned_long>::~allocator
                                          ((allocator<unsigned_long> *)0x1b1bae);
                              }
                              else if (*(int *)&local_20[1].m_Definition.
                                                super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                ._M_impl.super__Vector_impl_data._M_finish == 5) {
                                local_1118 = 0;
                                uStack_1110 = 0;
                                local_1108 = 0;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b1c7c);
                                local_1138 = 0;
                                uStack_1130 = 0;
                                local_1128 = 0;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b1cad);
                                adios2::core::IO::DefineVariable<float>
                                          (local_28,(vector *)local_20,(vector *)&local_1118,
                                           (vector *)&local_1138,SUB81(local_1010,0));
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc40._M_current);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc40._M_current);
                              }
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc40._M_current);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         in_stack_ffffffffffffdc40._M_current);
                            }
                          }
                          else {
                            sVar1 = local_20->m_StructSize;
                            DVar3 = helper::GetDataType<double>();
                            if ((DataType)sVar1 == DVar3) {
                              local_1140 = adios2::core::IO::InquireVariable<double>(local_28);
                              if (local_1140 == (Variable *)0x0) {
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc80,
                                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc78);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc80,
                                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc78);
                                if (*(int *)(local_28 + 0x58) != 0) {
                                  local_1178 = (unsigned_long *)
                                               std::
                                               vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               ::begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                  local_1180 = (unsigned_long *)
                                               std::
                                               vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               ::end((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                  std::
                                  reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                                  local_1188 = (unsigned_long *)
                                               std::
                                               vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               ::begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                  local_1190 = (unsigned_long *)
                                               std::
                                               vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               ::end((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                  std::
                                  reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                                }
                                if (*(int *)&local_20[1].m_Definition.
                                             super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                             ._M_impl.super__Vector_impl_data._M_finish == 1) {
                                  local_11a8 = 0;
                                  uStack_11a0 = 0;
                                  local_1198 = 0;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b1f39);
                                  local_11c8 = 0;
                                  uStack_11c0 = 0;
                                  local_11b8 = 0;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b1f6a);
                                  local_11e8 = 0;
                                  uStack_11e0 = 0;
                                  local_11d8 = 0;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b1f9b);
                                  adios2::core::IO::DefineVariable<double>
                                            (local_28,(vector *)local_20,(vector *)&local_11a8,
                                             (vector *)&local_11c8,SUB81(&local_11e8,0));
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          in_stack_ffffffffffffdc40._M_current);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          in_stack_ffffffffffffdc40._M_current);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          in_stack_ffffffffffffdc40._M_current);
                                }
                                else if (*(int *)&local_20[1].m_Definition.
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 2) {
                                  adios2::core::IO::DefineVariable<double>
                                            (local_28,(vector *)local_20,local_1170,local_1158,
                                             SUB81(local_1170,0));
                                }
                                else if (*(int *)&local_20[1].m_Definition.
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 4) {
                                  local_1218 = 0xfffffffffffffffd;
                                  local_1210 = &local_1218;
                                  local_1208 = 1;
                                  std::allocator<unsigned_long>::allocator
                                            ((allocator<unsigned_long> *)0x1b20e8);
                                  __l_10._M_len._0_4_ = in_stack_ffffffffffffdc70;
                                  __l_10._M_array = (iterator)in_stack_ffffffffffffdc68;
                                  __l_10._M_len._4_4_ = in_stack_ffffffffffffdc74;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)in_stack_ffffffffffffdc60._M_current,__l_10,
                                             (allocator_type *)in_stack_ffffffffffffdc58._M_current)
                                  ;
                                  local_1238 = 0;
                                  uStack_1230 = 0;
                                  local_1228 = 0;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b2143);
                                  local_1258 = 0;
                                  uStack_1250 = 0;
                                  local_1248 = 0;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b2174);
                                  adios2::core::IO::DefineVariable<double>
                                            (local_28,(vector *)local_20,local_1200,
                                             (vector *)&local_1238,SUB81(&local_1258,0));
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          in_stack_ffffffffffffdc40._M_current);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          in_stack_ffffffffffffdc40._M_current);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          in_stack_ffffffffffffdc40._M_current);
                                  std::allocator<unsigned_long>::~allocator
                                            ((allocator<unsigned_long> *)0x1b21da);
                                }
                                else if (*(int *)&local_20[1].m_Definition.
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 5) {
                                  local_1278 = 0;
                                  uStack_1270 = 0;
                                  local_1268 = 0;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b22a8);
                                  local_1298 = 0;
                                  uStack_1290 = 0;
                                  local_1288 = 0;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b22d9);
                                  adios2::core::IO::DefineVariable<double>
                                            (local_28,(vector *)local_20,(vector *)&local_1278,
                                             (vector *)&local_1298,SUB81(local_1170,0));
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          in_stack_ffffffffffffdc40._M_current);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          in_stack_ffffffffffffdc40._M_current);
                                }
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc40._M_current);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc40._M_current);
                              }
                            }
                            else {
                              sVar1 = local_20->m_StructSize;
                              DVar3 = helper::GetDataType<long_double>();
                              if ((DataType)sVar1 == DVar3) {
                                local_12a0 = adios2::core::IO::InquireVariable<long_double>
                                                       (local_28);
                                if (local_12a0 == (Variable *)0x0) {
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)in_stack_ffffffffffffdc80,
                                             (vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)in_stack_ffffffffffffdc78);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            ((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)in_stack_ffffffffffffdc80,
                                             (vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)in_stack_ffffffffffffdc78);
                                  if (*(int *)(local_28 + 0x58) != 0) {
                                    local_12d8 = (unsigned_long *)
                                                 std::
                                                 vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ::begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                    local_12e0 = (unsigned_long *)
                                                 std::
                                                 vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ::end((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                    std::
                                    reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                              (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                                    local_12e8 = (unsigned_long *)
                                                 std::
                                                 vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ::begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                    local_12f0 = (unsigned_long *)
                                                 std::
                                                 vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ::end((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                    std::
                                    reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                              (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38);
                                  }
                                  if (*(int *)&local_20[1].m_Definition.
                                               super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                               ._M_impl.super__Vector_impl_data._M_finish == 1) {
                                    local_1308 = 0;
                                    uStack_1300 = 0;
                                    local_12f8 = 0;
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b2565);
                                    local_1328 = 0;
                                    uStack_1320 = 0;
                                    local_1318 = 0;
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b2596);
                                    local_1348 = 0;
                                    uStack_1340 = 0;
                                    local_1338 = 0;
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b25c7);
                                    adios2::core::IO::DefineVariable<long_double>
                                              (local_28,(vector *)local_20,(vector *)&local_1308,
                                               (vector *)&local_1328,SUB81(&local_1348,0));
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )in_stack_ffffffffffffdc40._M_current);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )in_stack_ffffffffffffdc40._M_current);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )in_stack_ffffffffffffdc40._M_current);
                                  }
                                  else if (*(int *)&local_20[1].m_Definition.
                                                                                                        
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 2) {
                                    adios2::core::IO::DefineVariable<long_double>
                                              (local_28,(vector *)local_20,local_12d0,local_12b8,
                                               SUB81(local_12d0,0));
                                  }
                                  else if (*(int *)&local_20[1].m_Definition.
                                                                                                        
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 4) {
                                    local_1378 = 0xfffffffffffffffd;
                                    local_1370 = &local_1378;
                                    local_1368 = 1;
                                    std::allocator<unsigned_long>::allocator
                                              ((allocator<unsigned_long> *)0x1b2714);
                                    __l_11._M_len._0_4_ = in_stack_ffffffffffffdc70;
                                    __l_11._M_array = (iterator)in_stack_ffffffffffffdc68;
                                    __l_11._M_len._4_4_ = in_stack_ffffffffffffdc74;
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc60._M_current,__l_11,
                                           (allocator_type *)in_stack_ffffffffffffdc58._M_current);
                                    local_1398 = 0;
                                    uStack_1390 = 0;
                                    local_1388 = 0;
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b276f);
                                    local_13b8 = 0;
                                    uStack_13b0 = 0;
                                    local_13a8 = 0;
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b27a0);
                                    adios2::core::IO::DefineVariable<long_double>
                                              (local_28,(vector *)local_20,local_1360,
                                               (vector *)&local_1398,SUB81(&local_13b8,0));
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )in_stack_ffffffffffffdc40._M_current);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )in_stack_ffffffffffffdc40._M_current);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )in_stack_ffffffffffffdc40._M_current);
                                    std::allocator<unsigned_long>::~allocator
                                              ((allocator<unsigned_long> *)0x1b2806);
                                  }
                                  else if (*(int *)&local_20[1].m_Definition.
                                                                                                        
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 5) {
                                    local_13d8 = 0;
                                    uStack_13d0 = 0;
                                    local_13c8 = 0;
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b28d4);
                                    local_13f8 = 0;
                                    uStack_13f0 = 0;
                                    local_13e8 = 0;
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b2905);
                                    adios2::core::IO::DefineVariable<long_double>
                                              (local_28,(vector *)local_20,(vector *)&local_13d8,
                                               (vector *)&local_13f8,SUB81(local_12d0,0));
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )in_stack_ffffffffffffdc40._M_current);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )in_stack_ffffffffffffdc40._M_current);
                                  }
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          in_stack_ffffffffffffdc40._M_current);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          in_stack_ffffffffffffdc40._M_current);
                                }
                              }
                              else {
                                sVar1 = local_20->m_StructSize;
                                DVar3 = helper::GetDataType<std::complex<float>>();
                                if ((DataType)sVar1 == DVar3) {
                                  local_1400 = adios2::core::IO::
                                               InquireVariable<std::complex<float>>(local_28);
                                  if (local_1400 == (Variable *)0x0) {
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc80,
                                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc78);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc80,
                                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           in_stack_ffffffffffffdc78);
                                    if (*(int *)(local_28 + 0x58) != 0) {
                                      local_1438 = (unsigned_long *)
                                                   std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                      local_1440 = (unsigned_long *)
                                                   std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::end((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                      std::
                                      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38
                                                );
                                      local_1448 = (unsigned_long *)
                                                   std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                      local_1450 = (unsigned_long *)
                                                   std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::end((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                      std::
                                      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                (in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38
                                                );
                                    }
                                    if (*(int *)&local_20[1].m_Definition.
                                                 super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish == 1) {
                                      local_1468 = 0;
                                      uStack_1460 = 0;
                                      local_1458 = 0;
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b2b91);
                                      local_1488 = 0;
                                      uStack_1480 = 0;
                                      local_1478 = 0;
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b2bc2);
                                      local_14a8 = 0;
                                      uStack_14a0 = 0;
                                      local_1498 = 0;
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b2bf3);
                                      adios2::core::IO::DefineVariable<std::complex<float>>
                                                (local_28,(vector *)local_20,(vector *)&local_1468,
                                                 (vector *)&local_1488,SUB81(&local_14a8,0));
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)in_stack_ffffffffffffdc40._M_current);
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)in_stack_ffffffffffffdc40._M_current);
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)in_stack_ffffffffffffdc40._M_current);
                                    }
                                    else if (*(int *)&local_20[1].m_Definition.
                                                                                                            
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 2) {
                                      adios2::core::IO::DefineVariable<std::complex<float>>
                                                (local_28,(vector *)local_20,local_1430,local_1418,
                                                 SUB81(local_1430,0));
                                    }
                                    else if (*(int *)&local_20[1].m_Definition.
                                                                                                            
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 4) {
                                      local_14d8 = 0xfffffffffffffffd;
                                      local_14d0 = &local_14d8;
                                      local_14c8 = 1;
                                      std::allocator<unsigned_long>::allocator
                                                ((allocator<unsigned_long> *)0x1b2d40);
                                      __l_12._M_len._0_4_ = in_stack_ffffffffffffdc70;
                                      __l_12._M_array = (iterator)in_stack_ffffffffffffdc68;
                                      __l_12._M_len._4_4_ = in_stack_ffffffffffffdc74;
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)in_stack_ffffffffffffdc60._M_current,__l_12,
                                             (allocator_type *)in_stack_ffffffffffffdc58._M_current)
                                      ;
                                      local_14f8 = 0;
                                      uStack_14f0 = 0;
                                      local_14e8 = 0;
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b2d9b);
                                      local_1518 = 0;
                                      uStack_1510 = 0;
                                      local_1508 = 0;
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b2dcc);
                                      adios2::core::IO::DefineVariable<std::complex<float>>
                                                (local_28,(vector *)local_20,local_14c0,
                                                 (vector *)&local_14f8,SUB81(&local_1518,0));
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)in_stack_ffffffffffffdc40._M_current);
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)in_stack_ffffffffffffdc40._M_current);
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)in_stack_ffffffffffffdc40._M_current);
                                      std::allocator<unsigned_long>::~allocator
                                                ((allocator<unsigned_long> *)0x1b2e32);
                                    }
                                    else if (*(int *)&local_20[1].m_Definition.
                                                                                                            
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 5) {
                                      local_1538 = 0;
                                      uStack_1530 = 0;
                                      local_1528 = 0;
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b2f00);
                                      local_1558 = 0;
                                      uStack_1550 = 0;
                                      local_1548 = 0;
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)0x1b2f31);
                                      adios2::core::IO::DefineVariable<std::complex<float>>
                                                (local_28,(vector *)local_20,(vector *)&local_1538,
                                                 (vector *)&local_1558,SUB81(local_1430,0));
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)in_stack_ffffffffffffdc40._M_current);
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)in_stack_ffffffffffffdc40._M_current);
                                    }
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )in_stack_ffffffffffffdc40._M_current);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )in_stack_ffffffffffffdc40._M_current);
                                  }
                                }
                                else {
                                  sVar1 = local_20->m_StructSize;
                                  DVar3 = helper::GetDataType<std::complex<double>>();
                                  if ((DataType)sVar1 == DVar3) {
                                    local_1560 = adios2::core::IO::
                                                 InquireVariable<std::complex<double>>(local_28);
                                    if (local_1560 == (Variable *)0x0) {
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)in_stack_ffffffffffffdc80,
                                             (vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)in_stack_ffffffffffffdc78);
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)in_stack_ffffffffffffdc80,
                                             (vector<unsigned_long,_std::allocator<unsigned_long>_>
                                              *)in_stack_ffffffffffffdc78);
                                      if (*(int *)(local_28 + 0x58) != 0) {
                                        local_1598 = (unsigned_long *)
                                                     std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                        local_15a0 = (unsigned_long *)
                                                     std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::end((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                        std::
                                        reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                  (in_stack_ffffffffffffdc40,
                                                   in_stack_ffffffffffffdc38);
                                        local_15a8 = (unsigned_long *)
                                                     std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::begin((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                        local_15b0 = (unsigned_long *)
                                                     std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::end((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)CONCAT44(in_stack_ffffffffffffdc2c,
                                                             in_stack_ffffffffffffdc28));
                                        std::
                                        reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                  (in_stack_ffffffffffffdc40,
                                                   in_stack_ffffffffffffdc38);
                                      }
                                      if (*(int *)&local_20[1].m_Definition.
                                                                                                      
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 1) {
                                        local_15c8 = 0;
                                        uStack_15c0 = 0;
                                        local_15b8 = 0;
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                *)0x1b31bd);
                                        local_15e8 = 0;
                                        uStack_15e0 = 0;
                                        local_15d8 = 0;
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                *)0x1b31ee);
                                        local_1608 = 0;
                                        uStack_1600 = 0;
                                        local_15f8 = 0;
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                *)0x1b321f);
                                        adios2::core::IO::DefineVariable<std::complex<double>>
                                                  (local_28,(vector *)local_20,(vector *)&local_15c8
                                                   ,(vector *)&local_15e8,SUB81(&local_1608,0));
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)in_stack_ffffffffffffdc40._M_current);
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)in_stack_ffffffffffffdc40._M_current);
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)in_stack_ffffffffffffdc40._M_current);
                                      }
                                      else if (*(int *)&local_20[1].m_Definition.
                                                                                                                
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 2) {
                                        adios2::core::IO::DefineVariable<std::complex<double>>
                                                  (local_28,(vector *)local_20,local_1590,local_1578
                                                   ,SUB81(local_1590,0));
                                      }
                                      else if (*(int *)&local_20[1].m_Definition.
                                                                                                                
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 4) {
                                        local_1638 = 0xfffffffffffffffd;
                                        local_1630 = &local_1638;
                                        local_1628 = 1;
                                        std::allocator<unsigned_long>::allocator
                                                  ((allocator<unsigned_long> *)0x1b336c);
                                        __l_13._M_len._0_4_ = in_stack_ffffffffffffdc70;
                                        __l_13._M_array = (iterator)in_stack_ffffffffffffdc68;
                                        __l_13._M_len._4_4_ = in_stack_ffffffffffffdc74;
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                *)in_stack_ffffffffffffdc60._M_current,__l_13,
                                               (allocator_type *)
                                               in_stack_ffffffffffffdc58._M_current);
                                        uVar16 = 0;
                                        uVar17 = 0;
                                        local_1658 = 0;
                                        uStack_1650 = 0;
                                        local_1648 = 0;
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                *)0x1b33c1);
                                        local_1668 = 0;
                                        local_1678 = uVar16;
                                        uStack_1670 = uVar17;
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                *)0x1b33ef);
                                        adios2::core::IO::DefineVariable<std::complex<double>>
                                                  (local_28,(vector *)local_20,local_1620,
                                                   (vector *)&local_1658,SUB81(&local_1678,0));
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)in_stack_ffffffffffffdc40._M_current);
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)in_stack_ffffffffffffdc40._M_current);
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)in_stack_ffffffffffffdc40._M_current);
                                        std::allocator<unsigned_long>::~allocator
                                                  ((allocator<unsigned_long> *)0x1b3452);
                                      }
                                      else if (*(int *)&local_20[1].m_Definition.
                                                                                                                
                                                  super__Vector_base<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish == 5) {
                                        uVar12 = SUB84(local_20,0);
                                        uVar13 = (undefined4)((ulong)local_20 >> 0x20);
                                        uVar16 = 0;
                                        uVar17 = 0;
                                        local_1698 = 0;
                                        uStack_1690 = 0;
                                        local_1688 = 0;
                                        pvVar14 = (vector *)&local_1698;
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                *)0x1b3514);
                                        local_16a8 = 0;
                                        pvVar15 = (vector *)&local_16b8;
                                        local_16b8 = uVar16;
                                        uStack_16b0 = uVar17;
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                *)0x1b353f);
                                        adios2::core::IO::DefineVariable<std::complex<double>>
                                                  (local_28,(vector *)CONCAT44(uVar13,uVar12),
                                                   pvVar14,pvVar15,SUB81(local_1590,0));
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)in_stack_ffffffffffffdc40._M_current);
                                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                        ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)in_stack_ffffffffffffdc40._M_current);
                                      }
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)in_stack_ffffffffffffdc40._M_current);
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      ~vector((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)in_stack_ffffffffffffdc40._M_current);
                                    }
                                  }
                                  else {
                                    paVar11 = &local_16d9;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_16d8,"Engine",paVar11);
                                    paVar11 = &local_1701;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_1700,"SscHelper",paVar11);
                                    in_stack_ffffffffffffdc40._M_current =
                                         (unsigned_long *)&local_1729;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              (local_1728,"DeserializeVariable",
                                               (allocator *)in_stack_ffffffffffffdc40._M_current);
                                    paVar11 = &local_1751;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              (local_1750,"unknown variable data type",paVar11);
                                    helper::Throw<std::runtime_error>
                                              (in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc88,
                                               in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,
                                               in_stack_ffffffffffffdc74);
                                    std::__cxx11::string::~string(local_1750);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_1751)
                                    ;
                                    std::__cxx11::string::~string(local_1728);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_1729)
                                    ;
                                    std::__cxx11::string::~string(local_1700);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_1701)
                                    ;
                                    std::__cxx11::string::~string(local_16d8);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_16d9)
                                    ;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffdc40._M_current);
  return;
}

Assistant:

void DeserializeVariable(const Buffer &input, const ShapeID shapeId, uint64_t &pos, BlockInfo &b,
                         IO &io, const bool regIO,
                         std::unordered_map<std::string, StructDefinition> &StructDefs)
{
    b.shapeId = static_cast<ShapeID>(shapeId);

    uint8_t nameSize = input[pos];
    ++pos;

    std::vector<char> name(nameSize);
    std::memcpy(name.data(), input.data(pos), nameSize);
    b.name = std::string(name.begin(), name.end());
    pos += nameSize;

    b.type = static_cast<DataType>(input[pos]);
    ++pos;

    if (b.type == DataType::Struct)
    {
        uint8_t structDefSize = input.value<uint8_t>(pos);
        ++pos;
        std::vector<char> structDefChar(structDefSize);
        std::memcpy(structDefChar.data(), input.data(pos), structDefSize);
        pos += structDefSize;
        b.structDef = std::string(structDefChar.begin(), structDefChar.end());
    }

    b.elementSize = input.value<uint64_t>(pos);
    pos += 8;

    uint8_t shapeSize = input[pos];
    ++pos;
    b.shape.resize(shapeSize);
    b.start.resize(shapeSize);
    b.count.resize(shapeSize);

    std::memcpy(b.shape.data(), input.data(pos), 8 * shapeSize);
    pos += 8 * shapeSize;

    std::memcpy(b.start.data(), input.data(pos), 8 * shapeSize);
    pos += 8 * shapeSize;

    std::memcpy(b.count.data(), input.data(pos), 8 * shapeSize);
    pos += 8 * shapeSize;

    b.bufferStart = input.value<uint64_t>(pos);
    pos += 8;

    b.bufferCount = input.value<uint64_t>(pos);
    pos += 8;

    uint8_t valueSize = input[pos];
    pos++;
    b.value.resize(valueSize);
    if (valueSize > 0)
    {
        std::memcpy(b.value.data(), input.data() + pos, valueSize);
        pos += valueSize;
    }

    if (regIO)
    {
        if (b.type == DataType::Struct)
        {
            auto v = io.InquireStructVariable(b.name);
            if (!v)
            {
                Dims vStart = b.start;
                Dims vShape = b.shape;
                if (io.m_ArrayOrder != ArrayOrdering::RowMajor)
                {
                    std::reverse(vStart.begin(), vStart.end());
                    std::reverse(vShape.begin(), vShape.end());
                }
                if (b.shapeId == ShapeID::GlobalArray)
                {
                    StructDefinition *def = nullptr;
                    auto it = StructDefs.find(b.structDef);
                    if (it != StructDefs.end())
                    {
                        def = &it->second;
                    }
                    if (def == nullptr)
                    {
                        helper::Throw<std::runtime_error>(
                            "Engine", "SscHelper", "DeserializeVariable",
                            "struct type " + b.structDef + " not defined");
                    }
                    else
                    {
                        io.DefineStructVariable(b.name, *def, vShape, vStart, vShape);
                    }
                }
            }
        }
#define declare_type(T)                                                                            \
    else if (b.type == helper::GetDataType<T>())                                                   \
    {                                                                                              \
        auto v = io.InquireVariable<T>(b.name);                                                    \
        if (!v)                                                                                    \
        {                                                                                          \
            Dims vStart = b.start;                                                                 \
            Dims vShape = b.shape;                                                                 \
            if (io.m_ArrayOrder != ArrayOrdering::RowMajor)                                        \
            {                                                                                      \
                std::reverse(vStart.begin(), vStart.end());                                        \
                std::reverse(vShape.begin(), vShape.end());                                        \
            }                                                                                      \
            if (b.shapeId == ShapeID::GlobalValue)                                                 \
            {                                                                                      \
                io.DefineVariable<T>(b.name);                                                      \
            }                                                                                      \
            else if (b.shapeId == ShapeID::GlobalArray)                                            \
            {                                                                                      \
                io.DefineVariable<T>(b.name, vShape, vStart, vShape);                              \
            }                                                                                      \
            else if (b.shapeId == ShapeID::LocalValue)                                             \
            {                                                                                      \
                io.DefineVariable<T>(b.name, {adios2::LocalValueDim});                             \
            }                                                                                      \
            else if (b.shapeId == ShapeID::LocalArray)                                             \
            {                                                                                      \
                io.DefineVariable<T>(b.name, {}, {}, vShape);                                      \
            }                                                                                      \
        }                                                                                          \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        else
        {
            helper::Throw<std::runtime_error>("Engine", "SscHelper", "DeserializeVariable",
                                              "unknown variable data type");
        }
    }